

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void libtorrent::aux::apply_deprecated_dht_settings
               (vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>
                *sett,bdecode_node *s)

{
  bool bVar1;
  int64_t iVar2;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  string_view key_11;
  string_view key_12;
  string_view key_13;
  string_view key_14;
  string_view key_15;
  string_view key_16;
  bdecode_node val;
  bdecode_node local_60;
  
  val._32_12_ = SUB1612((undefined1  [16])0x0,4);
  val._16_12_ = SUB1612((undefined1  [16])0x0,0);
  val.m_root_tokens._4_4_ = 0;
  val.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  val.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  val.m_token_idx = -1;
  val.m_last_index = -1;
  val.m_last_token = -1;
  val.m_size = -1;
  key._M_str = "max_peers_reply";
  key._M_len = 0xf;
  bdecode_node::dict_find_int(&local_60,s,key);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_int((settings_pack *)sett,0x4089,(int)iVar2);
  }
  key_00._M_str = "search_branching";
  key_00._M_len = 0x10;
  bdecode_node::dict_find_int(&local_60,s,key_00);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_int((settings_pack *)sett,0x408a,(int)iVar2);
  }
  key_01._M_str = "max_fail_count";
  key_01._M_len = 0xe;
  bdecode_node::dict_find_int(&local_60,s,key_01);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_int((settings_pack *)sett,0x408b,(int)iVar2);
  }
  key_02._M_str = "max_torrents";
  key_02._M_len = 0xc;
  bdecode_node::dict_find_int(&local_60,s,key_02);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_int((settings_pack *)sett,0x408c,(int)iVar2);
  }
  key_03._M_str = "max_dht_items";
  key_03._M_len = 0xd;
  bdecode_node::dict_find_int(&local_60,s,key_03);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_int((settings_pack *)sett,0x408d,(int)iVar2);
  }
  key_04._M_str = "max_peers";
  key_04._M_len = 9;
  bdecode_node::dict_find_int(&local_60,s,key_04);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_int((settings_pack *)sett,0x408e,(int)iVar2);
  }
  key_05._M_str = "max_torrent_search_reply";
  key_05._M_len = 0x18;
  bdecode_node::dict_find_int(&local_60,s,key_05);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_int((settings_pack *)sett,0x408f,(int)iVar2);
  }
  key_06._M_str = "restrict_routing_ips";
  key_06._M_len = 0x14;
  bdecode_node::dict_find_int(&local_60,s,key_06);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_bool((settings_pack *)sett,0x8046,iVar2 != 0);
  }
  key_07._M_str = "restrict_search_ips";
  key_07._M_len = 0x13;
  bdecode_node::dict_find_int(&local_60,s,key_07);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_bool((settings_pack *)sett,0x8047,iVar2 != 0);
  }
  key_08._M_str = "extended_routing_table";
  key_08._M_len = 0x16;
  bdecode_node::dict_find_int(&local_60,s,key_08);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_bool((settings_pack *)sett,0x8048,iVar2 != 0);
  }
  key_09._M_str = "aggressive_lookups";
  key_09._M_len = 0x12;
  bdecode_node::dict_find_int(&local_60,s,key_09);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_bool((settings_pack *)sett,0x8049,iVar2 != 0);
  }
  key_10._M_str = "privacy_lookups";
  key_10._M_len = 0xf;
  bdecode_node::dict_find_int(&local_60,s,key_10);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_bool((settings_pack *)sett,0x804a,iVar2 != 0);
  }
  key_11._M_str = "enforce_node_id";
  key_11._M_len = 0xf;
  bdecode_node::dict_find_int(&local_60,s,key_11);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_bool((settings_pack *)sett,0x804b,iVar2 != 0);
  }
  key_12._M_str = "ignore_dark_internet";
  key_12._M_len = 0x14;
  bdecode_node::dict_find_int(&local_60,s,key_12);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_bool((settings_pack *)sett,0x804c,iVar2 != 0);
  }
  key_13._M_str = "block_timeout";
  key_13._M_len = 0xd;
  bdecode_node::dict_find_int(&local_60,s,key_13);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_int((settings_pack *)sett,0x4090,(int)iVar2);
  }
  key_14._M_str = "block_ratelimit";
  key_14._M_len = 0xf;
  bdecode_node::dict_find_int(&local_60,s,key_14);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_int((settings_pack *)sett,0x4091,(int)iVar2);
  }
  key_15._M_str = "read_only";
  key_15._M_len = 9;
  bdecode_node::dict_find_int(&local_60,s,key_15);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_bool((settings_pack *)sett,0x804d,iVar2 != 0);
  }
  key_16._M_str = "item_lifetime";
  key_16._M_len = 0xd;
  bdecode_node::dict_find_int(&local_60,s,key_16);
  bdecode_node::operator=(&val,&local_60);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&local_60);
  bVar1 = bdecode_node::operator_cast_to_bool(&val);
  if (bVar1) {
    iVar2 = bdecode_node::int_value(&val);
    settings_pack::set_int((settings_pack *)sett,0x4092,(int)iVar2);
  }
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&val);
  return;
}

Assistant:

void apply_deprecated_dht_settings(settings_pack& sett, bdecode_node const& s)
{
	bdecode_node val;
	val = s.dict_find_int("max_peers_reply");
	if (val) sett.set_int(settings_pack::dht_max_peers_reply, int(val.int_value()));
	val = s.dict_find_int("search_branching");
	if (val) sett.set_int(settings_pack::dht_search_branching, int(val.int_value()));
	val = s.dict_find_int("max_fail_count");
	if (val) sett.set_int(settings_pack::dht_max_fail_count, int(val.int_value()));
	val = s.dict_find_int("max_torrents");
	if (val) sett.set_int(settings_pack::dht_max_torrents, int(val.int_value()));
	val = s.dict_find_int("max_dht_items");
	if (val) sett.set_int(settings_pack::dht_max_dht_items, int(val.int_value()));
	val = s.dict_find_int("max_peers");
	if (val) sett.set_int(settings_pack::dht_max_peers, int(val.int_value()));
	val = s.dict_find_int("max_torrent_search_reply");
	if (val) sett.set_int(settings_pack::dht_max_torrent_search_reply, int(val.int_value()));
	val = s.dict_find_int("restrict_routing_ips");
	if (val) sett.set_bool(settings_pack::dht_restrict_routing_ips, (val.int_value() != 0));
	val = s.dict_find_int("restrict_search_ips");
	if (val) sett.set_bool(settings_pack::dht_restrict_search_ips, (val.int_value() != 0));
	val = s.dict_find_int("extended_routing_table");
	if (val) sett.set_bool(settings_pack::dht_extended_routing_table, (val.int_value() != 0));
	val = s.dict_find_int("aggressive_lookups");
	if (val) sett.set_bool(settings_pack::dht_aggressive_lookups, (val.int_value() != 0));
	val = s.dict_find_int("privacy_lookups");
	if (val) sett.set_bool(settings_pack::dht_privacy_lookups, (val.int_value() != 0));
	val = s.dict_find_int("enforce_node_id");
	if (val) sett.set_bool(settings_pack::dht_enforce_node_id, (val.int_value() != 0));
	val = s.dict_find_int("ignore_dark_internet");
	if (val) sett.set_bool(settings_pack::dht_ignore_dark_internet, (val.int_value() != 0));
	val = s.dict_find_int("block_timeout");
	if (val) sett.set_int(settings_pack::dht_block_timeout, int(val.int_value()));
	val = s.dict_find_int("block_ratelimit");
	if (val) sett.set_int(settings_pack::dht_block_ratelimit, int(val.int_value()));
	val = s.dict_find_int("read_only");
	if (val) sett.set_bool(settings_pack::dht_read_only, (val.int_value() != 0));
	val = s.dict_find_int("item_lifetime");
	if (val) sett.set_int(settings_pack::dht_item_lifetime, int(val.int_value()));
}